

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocument_p.cpp
# Opt level: O3

void __thiscall
QTextDocumentPrivate::setLayout(QTextDocumentPrivate *this,QAbstractTextDocumentLayout *layout)

{
  bool bVar1;
  uint uVar2;
  QAbstractTextDocumentLayout *pQVar3;
  QTextDocument *this_00;
  Header *pHVar4;
  QTextBlockData *pQVar5;
  QTextLayout *this_01;
  uint n;
  int iVar6;
  
  pQVar3 = this->lout;
  if (pQVar3 != layout) {
    this_00 = *(QTextDocument **)&this->field_0x8;
    if (pQVar3 == (QAbstractTextDocumentLayout *)0x0) {
      this->lout = layout;
    }
    else {
      (**(code **)(*(long *)pQVar3 + 0x20))();
      this->lout = layout;
      pHVar4 = (this->blocks).data.field_0.head;
      uVar2 = pHVar4->root;
      do {
        n = uVar2;
        if (n == 0) goto LAB_004d0bd6;
        uVar2 = *(uint *)((long)pHVar4 + (ulong)n * 0x48 + 4);
      } while (uVar2 != 0);
      do {
        pQVar5 = (this->blocks).data.field_0.fragments;
        this_01 = pQVar5[n].layout;
        if (this_01 != (QTextLayout *)0x0) {
          QTextLayout::~QTextLayout(this_01);
        }
        operator_delete(this_01,8);
        pQVar5[n].layout = (QTextLayout *)0x0;
        if (pQVar5[n].userData != (QTextBlockUserData *)0x0) {
          (*(pQVar5[n].userData)->_vptr_QTextBlockUserData[1])();
        }
        pQVar5[n].userData = (QTextBlockUserData *)0x0;
        n = QFragmentMapData<QTextBlockData>::next(&(this->blocks).data,n);
      } while (n != 0);
    }
LAB_004d0bd6:
    QTextDocument::documentLayoutChanged(this_00);
    bVar1 = this->inContentsChange;
    this->inContentsChange = true;
    iVar6 = QFragmentMapData<QTextFragmentData>::length(&(this->fragments).data,0);
    QTextDocument::contentsChange(this_00,0,0,iVar6);
    this->inContentsChange = bVar1;
    pQVar3 = this->lout;
    if (pQVar3 != (QAbstractTextDocumentLayout *)0x0) {
      iVar6 = QFragmentMapData<QTextFragmentData>::length(&(this->fragments).data,0);
      (**(code **)(*(long *)pQVar3 + 0x90))(pQVar3,0,0,iVar6,*(code **)(*(long *)pQVar3 + 0x90));
      return;
    }
  }
  return;
}

Assistant:

void QTextDocumentPrivate::setLayout(QAbstractTextDocumentLayout *layout)
{
    Q_Q(QTextDocument);
    if (lout == layout)
        return;
    const bool firstLayout = !lout;
    delete lout;
    lout = layout;

    if (!firstLayout)
        for (BlockMap::Iterator it = blocks.begin(); !it.atEnd(); ++it)
            it->free();

    emit q->documentLayoutChanged();
    {
        QScopedValueRollback<bool> bg(inContentsChange, true);
        emit q->contentsChange(0, 0, length());
    }
    if (lout)
        lout->documentChanged(0, 0, length());
}